

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void utf::encodeCodePoint(utf8_t *p,utf32_t x)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  utf32_t x_local;
  utf8_t *p_local;
  
  bVar3 = (byte)x;
  if (x < 0x80) {
    *p = bVar3;
  }
  else {
    bVar1 = (byte)(x >> 0xc);
    bVar2 = (byte)(x >> 6);
    if (x < 0x10000) {
      if (x < 0x800) {
        *p = bVar2 | 0xc0;
        p[1] = bVar3 & 0x3f | 0x80;
      }
      else {
        *p = bVar1 | 0xe0;
        p[1] = bVar2 & 0x3f | 0x80;
        p[2] = bVar3 & 0x3f | 0x80;
      }
    }
    else if (x < 0x200000) {
      *p = (byte)(x >> 0x12) | 0xf0;
      p[1] = bVar1 & 0x3f | 0x80;
      p[2] = bVar2 & 0x3f | 0x80;
      p[3] = bVar3 & 0x3f | 0x80;
    }
    else {
      *p = -1;
    }
  }
  return;
}

Assistant:

void
encodeCodePoint(
	utf8_t* p,
	utf32_t x
) {
	if (x < 0x80) {
		p[0] = (uint8_t)x;                             // 0xxxxxxx
	} else if (x < 0x10000) {
		if (x < 0x800) {
			p[0] = (uint8_t)(x >> 6)          | 0xc0;  // 110xxxxx 10xxxxxx
			p[1] = (uint8_t)(x & 0x3f)        | 0x80;
		} else {
			p[0] = (uint8_t)(x >> 12)         | 0xe0;  // 1110xxxx 10xxxxxx 10xxxxxx
			p[1] = (uint8_t)((x >> 6) & 0x3f) | 0x80;
			p[2] = (uint8_t)(x & 0x3f)        | 0x80;
		}
	} else if (x < 0x200000) {
		p[0] = (uint8_t)(x >> 18)             | 0xf0; // 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
		p[1] = (uint8_t)((x >> 12) & 0x3f)    | 0x80;
		p[2] = (uint8_t)((x >> 6) & 0x3f)     | 0x80;
		p[3] = (uint8_t)(x & 0x3f)            | 0x80;
	} else {
		p[0] = -1;
	}
}